

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CropLayerParams::InternalSwap(CropLayerParams *this,CropLayerParams *other)

{
  int iVar1;
  BorderAmounts *pBVar2;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->offset_,&other->offset_);
  pBVar2 = this->cropamounts_;
  this->cropamounts_ = other->cropamounts_;
  other->cropamounts_ = pBVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void CropLayerParams::InternalSwap(CropLayerParams* other) {
  offset_.InternalSwap(&other->offset_);
  std::swap(cropamounts_, other->cropamounts_);
  std::swap(_cached_size_, other->_cached_size_);
}